

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void gai_matmul_shmem(char *transa,char *transb,void *alpha,void *beta,Integer atype,Integer g_a,
                     Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,
                     Integer bihi,Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,
                     Integer cjlo,Integer cjhi,Integer Ichunk,Integer Kchunk,Integer Jchunk,
                     DoubleComplex *a,DoubleComplex *b,DoubleComplex *c,short need_scaling)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DoubleComplex *b_00;
  DoubleComplex *a_00;
  void *alpha_00;
  DoubleComplex *pDVar6;
  long cdim_00;
  DoubleComplex *bdim_00;
  void *in_RDX;
  Integer *unaff_RBX;
  char *in_RSI;
  char *in_RDI;
  long in_R8;
  void *unaff_R12;
  Integer *unaff_R14;
  Integer *unaff_R15;
  Integer unaff_retaddr;
  int in_stack_00000018;
  int in_stack_00000020;
  Integer chi [2];
  Integer clo [2];
  long in_stack_00000080;
  SingleComplex ONE_CF;
  DoubleComplex ONE;
  short single_task_flag;
  Integer in_stack_000000a0;
  short do_put;
  int kend;
  int jend;
  int iend;
  int kstart;
  int jstart;
  int istart;
  Integer cdim;
  Integer bdim;
  Integer adim;
  Integer kdim;
  Integer khi;
  Integer klo;
  Integer jdim;
  Integer jhi;
  Integer jlo;
  Integer idim;
  Integer ihi;
  Integer ilo;
  Integer j1;
  Integer j0;
  Integer i1;
  Integer i0;
  Integer ld [2];
  Integer hiC [2];
  Integer loC [2];
  Integer get_new_B;
  Integer me;
  void *alpha_01;
  Integer *ld_00;
  Integer *hi;
  DoubleComplex *pDVar7;
  Integer g_a_00;
  DoubleComplex *local_190;
  long local_188;
  long local_180;
  Integer kdim_00;
  Integer jdim_00;
  undefined4 in_stack_fffffffffffffec8;
  short sVar8;
  short sVar9;
  int iVar10;
  DoubleComplex *local_110;
  DoubleComplex *local_108;
  DoubleComplex *pDVar11;
  int local_88 [2];
  int local_80;
  int local_78 [2];
  int local_70;
  long local_68;
  Integer local_60;
  short local_52;
  long local_48;
  void *local_38;
  char *local_30;
  char *local_28;
  
  local_52 = (short)kend;
  local_48 = in_R8;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  local_60 = pnga_nodeid();
  memset(local_78,0,0x10);
  memset(local_88,0,0x10);
  local_110 = (DoubleComplex *)0x0;
  sVar9 = 0;
  sVar8 = 0;
  kdim_00 = 0x3ff0000000000000;
  jdim_00 = 0;
  pnga_distribution(hiC[0],ld[1],(Integer *)ld[0],(Integer *)i0);
  iVar1 = local_78[0] + -1;
  iVar2 = local_88[0] + -1;
  iVar3 = local_70 + -1;
  iVar4 = local_80 + -1;
  iVar10 = 0;
  iVar5 = in_stack_00000020 - in_stack_00000018;
  if ((((DIRECT_ACCESS_OPT_FLAG != 0) && ((iVar2 - iVar1) + 1 <= clo[1])) &&
      ((long)((iVar4 - iVar3) + 1) <= (long)ONE_CF)) && (iVar5 + 1 <= in_stack_00000080)) {
    sVar8 = 1;
    pnga_access_ptr(cilo,(Integer *)g_c,(Integer *)bjhi,(void *)bjlo,(Integer *)bihi);
  }
  for (b_00 = (DoubleComplex *)(long)iVar3; (long)b_00 <= (long)iVar4;
      b_00 = (DoubleComplex *)((long)&b_00->real + (long)ONE_CF)) {
    if ((long)b_00 + (long)ONE_CF + -1 < (long)iVar4) {
      local_180 = (long)b_00 + (long)ONE_CF + -1;
    }
    else {
      local_180 = (long)iVar4;
    }
    a_00 = (DoubleComplex *)((local_180 - (long)b_00) + 1);
    if (local_52 == 0) {
      sVar9 = 1;
    }
    for (alpha_00 = (void *)(long)iVar10; (long)alpha_00 <= (long)iVar5;
        alpha_00 = (void *)(in_stack_00000080 + (long)alpha_00)) {
      if ((long)alpha_00 + in_stack_00000080 + -1 < (long)iVar5) {
        local_188 = (long)alpha_00 + in_stack_00000080 + -1;
      }
      else {
        local_188 = (long)iVar5;
      }
      pDVar6 = (DoubleComplex *)((local_188 - (long)alpha_00) + 1);
      local_68 = 1;
      for (cdim_00 = (long)iVar1; cdim_00 <= iVar2; cdim_00 = clo[1] + cdim_00) {
        if (cdim_00 + clo[1] + -1 < (long)iVar2) {
          local_190 = (DoubleComplex *)(cdim_00 + clo[1] + -1);
        }
        else {
          local_190 = (DoubleComplex *)(long)iVar2;
        }
        bdim_00 = (DoubleComplex *)((long)local_190 + (1 - cdim_00));
        if ((*local_28 == 'n') || (*local_28 == 'N')) {
          pDVar11 = bdim_00;
          pnga_get(unaff_retaddr,unaff_R15,unaff_R14,unaff_R12,unaff_RBX);
          local_108 = bdim_00;
          pDVar7 = a_00;
          bdim_00 = pDVar11;
        }
        else {
          pnga_get(unaff_retaddr,unaff_R15,unaff_R14,unaff_R12,unaff_RBX);
          local_108 = pDVar6;
          pDVar7 = a_00;
        }
        a_00 = pDVar7;
        if (local_68 != 0) {
          if ((*local_30 == 'n') || (*local_30 == 'N')) {
            pnga_get(unaff_retaddr,unaff_R15,unaff_R14,unaff_R12,unaff_RBX);
            local_110 = pDVar6;
            a_00 = pDVar7;
          }
          else {
            pnga_get(unaff_retaddr,unaff_R15,unaff_R14,unaff_R12,unaff_RBX);
            local_110 = pDVar7;
          }
          local_68 = 0;
        }
        alpha_01 = local_38;
        ld_00 = (Integer *)ONE.real;
        hi = (Integer *)ONE.imag;
        pDVar7 = local_110;
        g_a_00 = in_stack_000000a0;
        GAI_DGEMM(CONCAT44(iVar1,iVar3),(char *)CONCAT44(iVar10,iVar2),(char *)CONCAT44(iVar4,iVar5)
                  ,CONCAT26(sVar9,CONCAT24(sVar8,in_stack_fffffffffffffec8)),jdim_00,kdim_00,
                  alpha_00,a_00,local_180,b_00,(Integer)bdim_00,local_190,cdim_00);
        if (sVar8 != 1) {
          if ((local_48 == 0x3eb) || (local_48 == 0x3ee)) {
            if (sVar9 == 1) {
              pnga_put(g_a_00,(Integer *)pDVar7,hi,local_108,ld_00);
            }
            else {
              pnga_acc(g_a_00,(Integer *)pDVar7,hi,local_108,ld_00,alpha_01);
            }
          }
          else if (sVar9 == 1) {
            pnga_put(g_a_00,(Integer *)pDVar7,hi,local_108,ld_00);
          }
          else {
            pnga_acc(g_a_00,(Integer *)pDVar7,hi,local_108,ld_00,alpha_01);
          }
        }
      }
      sVar9 = 0;
    }
  }
  return;
}

Assistant:

static void gai_matmul_shmem(transa, transb, alpha, beta, atype,
			     g_a, ailo, aihi, ajlo, ajhi,
			     g_b, bilo, bihi, bjlo, bjhi,
			     g_c, cilo, cihi, cjlo, cjhi,
			     Ichunk, Kchunk, Jchunk, a,b,c, need_scaling)
     
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     Integer Ichunk, Kchunk, Jchunk, atype;
     void    *alpha, *beta;
     char    *transa, *transb;
     DoubleComplex *a, *b, *c;
     short int need_scaling;
{

  Integer me = pnga_nodeid();
  Integer get_new_B, loC[2]={0,0}, hiC[2]={0,0}, ld[2];
  Integer i0, i1, j0, j1;
  Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim, adim, bdim=0, cdim;
  int istart, jstart, kstart, iend, jend, kend;
  short int do_put=UNSET, single_task_flag=UNSET;
  DoubleComplex ONE = {1.,0.};
  SingleComplex ONE_CF = {1.,0.};
  Integer clo[2], chi[2];


  /* to skip accumulate and exploit data locality:
     get chunks according to "C" matrix distribution*/
  pnga_distribution(g_c, me, loC, hiC);
  istart = loC[0]-1; iend = hiC[0]-1;
  jstart = loC[1]-1; jend = hiC[1]-1;
  kstart = 0       ; kend = ajhi-ajlo;

  if(DIRECT_ACCESS_OPT_FLAG) {
    /* check if there is only one task. If so, then it is contiguous */
    if( (iend-istart+1 <= Ichunk) && (jend-jstart+1 <= Jchunk) &&
        (kend-kstart+1 <= Kchunk) ) {
      single_task_flag = SET;
      pnga_access_ptr(g_c, loC, hiC, &c, ld);
    }
  }

  /* loop through columns of g_c patch */
  for(jlo = jstart; jlo <= jend; jlo += Jchunk) { 
    jhi  = GA_MIN(jend, jlo+Jchunk-1);
    jdim = jhi - jlo +1;

    /* if beta=0,then for first shot we can do put,instead of accumulate */
    if(need_scaling == UNSET) do_put = SET;

    /* loop cols of g_a patch : loop rows of g_b patch*/
    for(klo = kstart; klo <= kend; klo += Kchunk) { 
      khi = GA_MIN(kend, klo+Kchunk-1);
      kdim= khi - klo +1;
      get_new_B = TRUE; /* Each pass thru' outer 2 loops means we 
                           need a different patch of B.*/
      /*loop through rows of g_c patch */
      for(ilo = istart; ilo <= iend; ilo += Ichunk){ 
        ihi = GA_MIN(iend, ilo+Ichunk-1);
        idim= cdim = ihi - ilo +1;

        /* STEP1(a): get matrix "A" chunk */
        i0= ailo+ilo; i1= ailo+ihi;
        j0= ajlo+klo; j1= ajlo+khi;
        if (*transa == 'n' || *transa == 'N'){
          clo[0] = i0;
          clo[1] = j0;
          chi[0] = i1;
          chi[1] = j1;
          adim=idim; pnga_get(g_a, clo, chi, a, &idim);
        }else{
          clo[0] = j0;
          clo[1] = i0;
          chi[0] = j1;
          chi[1] = i1;
          adim=kdim; pnga_get(g_a, clo, chi, a, &kdim);
        }

        /* STEP1(b): get matrix "B" chunk*/
        if(get_new_B) {/*Avoid rereading B if same patch as last time*/
          i0= bilo+klo; i1= bilo+khi;
          j0= bjlo+jlo; j1= bjlo+jhi;
          if (*transb == 'n' || *transb == 'N'){ 
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            bdim=kdim; pnga_get(g_b, clo, chi, b, &kdim);  
          }else {
            clo[0] = j0;
            clo[1] = i0;
            chi[0] = j1;
            chi[1] = i1;
            bdim=jdim; pnga_get(g_b, clo, chi, b, &jdim);
          }
          get_new_B = FALSE; /* Until J or K change again */
        }

        /* STEP2: Do the sequential matrix multiply - i.e.BLAS dgemm */
        GAI_DGEMM(atype, transa, transb, idim, jdim, kdim, alpha, 
            a, adim, b, bdim, c, cdim);

        /* STEP3: put/accumulate into "C" matrix */
        i0= cilo+ilo; i1= cilo+ihi;   
        j0= cjlo+jlo; j1= cjlo+jhi;	 
        /* if single_task_flag is SET (i.e =1), then there is no need to 
           update "C" matrix, as we use pointer directly in GAI_DGEMM */
        if(single_task_flag != SET) {
          switch(atype) {
            case C_FLOAT:
            case C_SCPL:
              clo[0] = i0;
              clo[1] = j0;
              chi[0] = i1;
              chi[1] = j1;
              if(do_put==SET) /* i.e.beta == 0.0 */
                pnga_put(g_c, clo, chi, (float *)c, &cdim);
              else {
                pnga_acc(g_c, clo, chi, (float*)c, &cdim, &ONE_CF);
              }
              break;
            default:
              clo[0] = i0;
              clo[1] = j0;
              chi[0] = i1;
              chi[1] = j1;
              if(do_put==SET) /* i.e.beta == 0.0 */
                pnga_put(g_c, clo, chi, (DoublePrecision*)c, &cdim);
              else {
                pnga_acc(g_c, clo, chi, (DoublePrecision*)c,
                    &cdim, (DoublePrecision*)&ONE);
              }
              break;
          }
        }
      }
      do_put = UNSET; /* In the second loop, accumulate should be done */
    }
  }
}